

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O3

HTS_Boolean
HTS_get_token_from_string_with_separator(char *str,size_t *index,char *buff,char separator)

{
  size_t sVar1;
  char cVar2;
  size_t sVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  
  if (str != (char *)0x0) {
    sVar1 = *index;
    cVar2 = str[sVar1];
    if (cVar2 != '\0') {
      if (cVar2 == separator) {
        sVar3 = sVar1;
        cVar5 = '\x01';
        do {
          if (cVar5 == '\0') {
            return '\0';
          }
          sVar1 = sVar3 + 1;
          *index = sVar1;
          cVar2 = str[sVar3 + 1];
          sVar3 = sVar1;
          cVar5 = separator;
        } while (cVar2 == separator);
      }
      bVar6 = cVar2 != '\0';
      if (bVar6 && cVar2 != separator) {
        lVar4 = 0;
        do {
          buff[lVar4] = cVar2;
          lVar4 = lVar4 + 1;
          sVar3 = *index;
          sVar1 = sVar3 + 1;
          *index = sVar1;
          cVar2 = str[sVar3 + 1];
          bVar6 = cVar2 != '\0';
          if (cVar2 == separator) break;
        } while (cVar2 != '\0');
      }
      else {
        lVar4 = 0;
      }
      if (bVar6) {
        *index = sVar1 + 1;
      }
      buff[lVar4] = '\0';
      return lVar4 != 0;
    }
  }
  return '\0';
}

Assistant:

HTS_Boolean HTS_get_token_from_string_with_separator(const char *str, size_t * index, char *buff, char separator)
{
   char c;
   size_t len = 0;

   if (str == NULL)
      return FALSE;

   c = str[(*index)];
   if (c == '\0')
      return FALSE;
   while (c == separator) {
      if (c == '\0')
         return FALSE;
      (*index)++;
      c = str[(*index)];
   }
   while (c != separator && c != '\0') {
      buff[len++] = c;
      (*index)++;
      c = str[(*index)];
   }
   if (c != '\0')
      (*index)++;

   buff[len] = '\0';

   if (len > 0)
      return TRUE;
   else
      return FALSE;
}